

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleinterp.cpp
# Opt level: O0

void __thiscall BrainFuckInterpreter::interpret(BrainFuckInterpreter *this)

{
  uint8_t uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  invalid_argument *this_00;
  bool bVar5;
  int local_24;
  char dch;
  char ch;
  int nesting;
  char *p;
  size_type n;
  BrainFuckInterpreter *this_local;
  
  memset(this->tape_,0,30000);
  this->dc_ = 0;
  this->pc_ = 0;
  uVar3 = std::__cxx11::string::length();
  lVar4 = std::__cxx11::string::data();
  while (this->pc_ < uVar3) {
    switch(*(undefined1 *)(lVar4 + (ulong)this->pc_)) {
    case 0x2b:
      this->tape_[this->dc_] = this->tape_[this->dc_] + '\x01';
      break;
    case 0x2c:
      uVar1 = std::istream::get();
      this->tape_[this->dc_] = uVar1;
      break;
    case 0x2d:
      this->tape_[this->dc_] = this->tape_[this->dc_] + 0xff;
      break;
    case 0x2e:
      std::ostream::put(-8);
      break;
    default:
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Unknown command");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    case 0x3c:
      this->dc_ = this->dc_ - 1;
      if (this->dc_ == 0xffffffff) {
        this->dc_ = 29999;
      }
      break;
    case 0x3e:
      this->dc_ = this->dc_ + 1;
      if (this->dc_ == 30000) {
        this->dc_ = 0;
      }
      break;
    case 0x5b:
      if (this->tape_[this->dc_] == '\0') {
        local_24 = 1;
        while( true ) {
          bVar5 = false;
          if (0 < local_24) {
            uVar2 = this->pc_ + 1;
            this->pc_ = uVar2;
            bVar5 = uVar2 < uVar3;
          }
          if (!bVar5) break;
          if (*(char *)(lVar4 + (ulong)this->pc_) == '[') {
            local_24 = local_24 + 1;
          }
          else if (*(char *)(lVar4 + (ulong)this->pc_) == ']') {
            local_24 = local_24 + -1;
          }
        }
      }
      break;
    case 0x5d:
      local_24 = 1;
      while( true ) {
        bVar5 = false;
        if (0 < local_24) {
          bVar5 = this->pc_ != 0;
        }
        if (!bVar5) break;
        this->pc_ = this->pc_ - 1;
        if (*(char *)(lVar4 + (ulong)this->pc_) == '[') {
          local_24 = local_24 + -1;
        }
        else if (*(char *)(lVar4 + (ulong)this->pc_) == ']') {
          local_24 = local_24 + 1;
        }
      }
      this->pc_ = this->pc_ - 1;
    }
    this->pc_ = this->pc_ + 1;
  }
  return;
}

Assistant:

void interpret() {
        memset(tape_, 0, TAPE_SIZE);
        dc_ = 0;
        pc_ = 0;

        auto n = p_.program.length();
        const char* p = p_.program.data();
        int nesting {0};

        while (pc_ < n) {
            const char ch = p[pc_];
            char dch;
            switch (ch)
            {
                case '+':
                    tape_[dc_]++;
                    break;
                case '-':
                    tape_[dc_]--;
                    break;
                case '>':
                    dc_++;
                    if (dc_ == TAPE_SIZE)
                        dc_ = 0;
                    break;
                case '<':
                    dc_--;
                    if (dc_ == -1)
                        dc_ = TAPE_SIZE - 1;
                    break;
                case '.':
                    dch = tape_[dc_];
                    std::cout.put(dch);
                    break;
                case ',':
                    tape_[dc_] = std::cin.get();
                    break;
                case '[':
                    if (tape_[dc_] == 0) {
                        nesting = 1;
                        while (nesting > 0 && ++pc_ < n) {
                            if (p[pc_] == '[') {
                                nesting++;
                            } else if (p[pc_] == ']') {
                                nesting--;
                            }
                        }
                    }
                    break;
                case ']':
                    nesting = 1;
                    while (nesting > 0 && pc_ > 0) {
                        pc_--;
                        if (p[pc_] == '[') {
                            nesting--;
                        } else if (p[pc_] == ']') {
                            nesting++;
                        }
                    }
                    pc_--;
                    break;

                default:
                    throw std::invalid_argument("Unknown command");
            }
            pc_++;
        }
    }